

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.hpp
# Opt level: O0

void __thiscall
xercesc_4_0::SchemaInfo::addRecursingType(SchemaInfo *this,DOMElement *elem,XMLCh *name)

{
  ValueVectorOf<const_xercesc_4_0::DOMElement_*> *this_00;
  ValueVectorOf<const_char16_t_*> *this_01;
  XMLCh *local_20;
  XMLCh *name_local;
  DOMElement *elem_local;
  SchemaInfo *this_local;
  
  local_20 = name;
  name_local = (XMLCh *)elem;
  elem_local = (DOMElement *)this;
  if (this->fRecursingAnonTypes == (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) {
    this_00 = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)
              XMemory::operator_new(0x28,this->fMemoryManager);
    ValueVectorOf<const_xercesc_4_0::DOMElement_*>::ValueVectorOf
              (this_00,8,this->fMemoryManager,false);
    this->fRecursingAnonTypes = this_00;
    this_01 = (ValueVectorOf<const_char16_t_*> *)XMemory::operator_new(0x28,this->fMemoryManager);
    ValueVectorOf<const_char16_t_*>::ValueVectorOf(this_01,8,this->fMemoryManager,false);
    this->fRecursingTypeNames = this_01;
  }
  ValueVectorOf<const_xercesc_4_0::DOMElement_*>::addElement
            (this->fRecursingAnonTypes,(DOMElement **)&name_local);
  ValueVectorOf<const_char16_t_*>::addElement(this->fRecursingTypeNames,&local_20);
  return;
}

Assistant:

inline void SchemaInfo::addRecursingType(const DOMElement* const elem,
                                         const XMLCh* const name) {

    if (!fRecursingAnonTypes) {
        fRecursingAnonTypes = new (fMemoryManager) ValueVectorOf<const DOMElement*>(8, fMemoryManager);
        fRecursingTypeNames = new (fMemoryManager) ValueVectorOf<const XMLCh*>(8, fMemoryManager);
    }

    fRecursingAnonTypes->addElement(elem);
    fRecursingTypeNames->addElement(name);
}